

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_once_resolved(Curl_easy *data,_Bool *protocol_done)

{
  connectdata *conn;
  Curl_dns_entry *pCVar1;
  CURLcode CVar2;
  
  conn = data->conn;
  pCVar1 = (data->state).async.dns;
  if (pCVar1 != (Curl_dns_entry *)0x0) {
    conn->dns_entry = pCVar1;
    (data->state).async.dns = (Curl_dns_entry *)0x0;
  }
  CVar2 = Curl_setup_conn(data,protocol_done);
  if (CVar2 != CURLE_OK) {
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data,conn,true);
    Curl_disconnect(data,conn,true);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_once_resolved(struct Curl_easy *data, bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn = data->conn;

#ifdef USE_CURL_ASYNC
  if(data->state.async.dns) {
    conn->dns_entry = data->state.async.dns;
    data->state.async.dns = NULL;
  }
#endif

  result = Curl_setup_conn(data, protocol_done);

  if(result) {
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }
  return result;
}